

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O0

void bcache_print_items(void)

{
  char cVar1;
  fnamedic_item *pfVar2;
  avl_node *paVar3;
  char *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  size_t i_1;
  size_t idx;
  avl_node *a;
  list_elem *ee;
  dirty_item *dirty;
  bcache_item *item;
  fnamedic_item *fname;
  uint8_t *ptr;
  size_t bnodes_local;
  size_t docs_local;
  size_t bnodes;
  size_t docs;
  size_t scores_local [100];
  size_t i;
  size_t scores [100];
  size_t ndirty;
  size_t nclean;
  size_t nfileitems;
  size_t nitems;
  size_t nfiles;
  size_t n;
  char tmp_buf [4096];
  string ss_local;
  string ss;
  memory_order order;
  char *lock;
  undefined4 uVar13;
  undefined8 uVar12;
  ulong local_1738;
  ulong local_1730;
  avl_node *local_1718;
  list_elem *local_1710;
  ulong local_16e8;
  ulong local_16e0;
  ulong local_16d8;
  ulong local_16d0;
  uint local_16c8 [202];
  ulong local_13a0;
  uint local_1398 [200];
  long local_1078;
  long local_1070;
  long local_1068;
  ulong local_1060;
  ulong local_1058;
  ulong local_1050;
  char local_1048 [2424];
  string local_40 [32];
  string local_20 [32];
  
  std::__cxx11::string::string(local_20);
  std::__cxx11::string::string(local_40);
  local_1050 = 1;
  local_1078 = 0;
  local_1070 = 0;
  local_1068 = 0;
  local_1060 = 0;
  local_1058 = 0;
  local_16d8 = 0;
  local_16d0 = 0;
  memset(local_1398,0,800);
  snprintf(local_1048,0xfff," === Block cache statistics summary ===\n");
  std::__cxx11::string::operator+=(local_40,local_1048);
  uVar12 = 0;
  lock = "Clean";
  uVar11 = 0;
  snprintf(local_1048,0xfff,"%3s %20s (%6s)(%6s)(c%6s d%6s)","No","Filename","#Pages","#Evict",
           "Clean","Dirty");
  std::__cxx11::string::operator+=(local_40,local_1048);
  snprintf(local_1048,0xfff,"%6s%6s","Doc","Node");
  std::__cxx11::string::operator+=(local_40,local_1048);
  for (local_13a0 = 0; local_13a0 <= local_1050; local_13a0 = local_13a0 + 1) {
    snprintf(local_1048,0xfff,"   [%d] ",local_13a0 & 0xffffffff);
    std::__cxx11::string::operator+=(local_40,local_1048);
  }
  snprintf(local_1048,0xfff,"\n");
  std::__cxx11::string::operator+=(local_40,local_1048);
  reader_lock((fdb_rw_lock *)lock);
  for (local_1730 = 0; local_1730 < num_files; local_1730 = local_1730 + 1) {
    pfVar2 = file_list[local_1730];
    memset(local_16c8,0,800);
    local_1078 = 0;
    local_1070 = 0;
    local_1068 = 0;
    local_16e8 = 0;
    local_16e0 = 0;
    local_1738 = 0;
    while( true ) {
      order = (memory_order)((ulong)uVar11 >> 0x20);
      uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
      if (pfVar2->num_shards <= local_1738) break;
      pthread_spin_lock(&pfVar2->shards[local_1738].lock);
      local_1710 = list_begin(&pfVar2->shards[local_1738].cleanlist);
      local_1718 = avl_first(&pfVar2->shards[local_1738].tree);
      for (; local_1710 != (list_elem *)0x0; local_1710 = list_next(local_1710)) {
        uVar6 = (ulong)*(byte *)((long)&local_1710[1].prev + 1);
        *(long *)(local_1398 + uVar6 * 2) = *(long *)(local_1398 + uVar6 * 2) + 1;
        uVar6 = (ulong)*(byte *)((long)&local_1710[1].prev + 1);
        *(long *)(local_16c8 + uVar6 * 2) = *(long *)(local_16c8 + uVar6 * 2) + 1;
        local_1060 = local_1060 + 1;
        local_1068 = local_1068 + 1;
        local_1070 = local_1070 + 1;
        cVar1 = *(char *)((long)local_1710[-2].prev + (long)bcache_blocksize + -1);
        if (cVar1 == -0x23) {
          local_16e0 = local_16e0 + 1;
        }
        else if (cVar1 == -1) {
          local_16e8 = local_16e8 + 1;
        }
      }
      for (; local_1718 != (avl_node *)0x0; local_1718 = avl_next(local_1718)) {
        paVar3 = local_1718[-1].right;
        uVar6 = (ulong)*(byte *)((long)&paVar3[2].left + 1);
        *(long *)(local_1398 + uVar6 * 2) = *(long *)(local_1398 + uVar6 * 2) + 1;
        uVar6 = (ulong)*(byte *)((long)&paVar3[2].left + 1);
        *(long *)(local_16c8 + uVar6 * 2) = *(long *)(local_16c8 + uVar6 * 2) + 1;
        local_1060 = local_1060 + 1;
        local_1068 = local_1068 + 1;
        local_1078 = local_1078 + 1;
        cVar1 = *(char *)((long)paVar3->left + (long)bcache_blocksize + -1);
        if (cVar1 == -0x23) {
          local_16e0 = local_16e0 + 1;
        }
        else if (cVar1 == -1) {
          local_16e8 = local_16e8 + 1;
        }
      }
      pthread_spin_unlock(&pfVar2->shards[local_1738].lock);
      local_1738 = local_1738 + 1;
    }
    uVar5 = (int)local_1058 + 1;
    pcVar4 = pfVar2->filename;
    uVar7 = atomic_get_uint64_t((atomic<unsigned_long> *)lock,order);
    uVar8 = atomic_get_uint64_t((atomic<unsigned_long> *)lock,order);
    uVar12 = CONCAT44(uVar13,(undefined4)local_1078);
    lock = (char *)CONCAT44((int)((ulong)lock >> 0x20),(undefined4)local_1070);
    uVar11 = CONCAT44(order,(int)uVar8);
    snprintf(local_1048,0xfff,"%3d %20s (%6d)(%6d)(c%6d d%6d)",(ulong)uVar5,pcVar4,
             uVar7 & 0xffffffff,uVar11,lock,uVar12);
    std::__cxx11::string::operator+=(local_40,local_1048);
    snprintf(local_1048,0xfff,"%6d%6d",local_16e0 & 0xffffffff,local_16e8 & 0xffffffff);
    std::__cxx11::string::operator+=(local_40,local_1048);
    for (local_1738 = 0; local_1738 <= local_1050; local_1738 = local_1738 + 1) {
      snprintf(local_1048,0xfff,"%6d ",(ulong)local_16c8[local_1738 * 2]);
      std::__cxx11::string::operator+=(local_40,local_1048);
    }
    snprintf(local_1048,0xfff,"\n");
    std::__cxx11::string::operator+=(local_40,local_1048);
    local_16d0 = local_16e0 + local_16d0;
    local_16d8 = local_16e8 + local_16d8;
    local_1058 = local_1058 + 1;
    lVar9 = std::__cxx11::string::size();
    lVar10 = std::__cxx11::string::size();
    if (4000 < (ulong)(lVar9 + lVar10)) {
      lock = (char *)std::__cxx11::string::c_str();
      uVar11 = 0;
      fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                   ,"bcache_print_items",0x64e);
      std::__cxx11::string::clear();
    }
    std::__cxx11::string::operator+=(local_20,local_40);
    std::__cxx11::string::clear();
  }
  reader_unlock((fdb_rw_lock *)lock);
  snprintf(local_1048,0xfff," ===\n");
  std::__cxx11::string::operator+=(local_40,local_1048);
  snprintf(local_1048,0xfff,"%d files %d items\n",local_1058 & 0xffffffff,local_1060 & 0xffffffff);
  std::__cxx11::string::operator+=(local_40,local_1048);
  for (local_13a0 = 0; local_13a0 <= local_1050; local_13a0 = local_13a0 + 1) {
    snprintf(local_1048,0xfff,"[%d]: %d\n",local_13a0 & 0xffffffff,(ulong)local_1398[local_13a0 * 2]
            );
    std::__cxx11::string::operator+=(local_40,local_1048);
  }
  snprintf(local_1048,0xfff,"Documents: %d blocks\n",local_16d0 & 0xffffffff);
  std::__cxx11::string::operator+=(local_40,local_1048);
  snprintf(local_1048,0xfff,"Index nodes: %d blocks\n",local_16d8 & 0xffffffff);
  std::__cxx11::string::operator+=(local_40,local_1048);
  lVar9 = std::__cxx11::string::size();
  lVar10 = std::__cxx11::string::size();
  if (4000 < (ulong)(lVar9 + lVar10)) {
    uVar11 = std::__cxx11::string::c_str();
    fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                 ,"bcache_print_items",0x65f,"%s",uVar11);
    std::__cxx11::string::clear();
  }
  std::__cxx11::string::operator+=(local_20,local_40);
  std::__cxx11::string::clear();
  uVar11 = std::__cxx11::string::c_str();
  fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
               ,"bcache_print_items",0x664,"%s",uVar11);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string(local_20);
  return;
}

Assistant:

void bcache_print_items()
{
    std::string ss;
    std::string ss_local;
    char tmp_buf[4096];
    size_t n=1;
    size_t nfiles, nitems, nfileitems, nclean, ndirty;
    size_t scores[100], i, scores_local[100];
    size_t docs, bnodes;
    size_t docs_local, bnodes_local;
    uint8_t *ptr;

    nfiles = nitems = nfileitems = nclean = ndirty = 0;
    docs = bnodes = 0;
    memset(scores, 0, sizeof(size_t)*100);

    struct fnamedic_item *fname;
    struct bcache_item *item;
    struct dirty_item *dirty;
    struct list_elem *ee;
    struct avl_node *a;

    ADD2BUF(" === Block cache statistics summary ===\n");
    ADD2BUF("%3s %20s (%6s)(%6s)(c%6s d%6s)",
        "No", "Filename", "#Pages", "#Evict", "Clean", "Dirty");
#ifdef __CRC32
    ADD2BUF("%6s%6s", "Doc", "Node");
#endif
    for (i=0;i<=n;++i) {
        ADD2BUF("   [%d] ", (int)i);
    }
    ADD2BUF("\n");

    reader_lock(&filelist_lock);
    for (size_t idx = 0; idx < num_files; ++idx) {
        fname = file_list[idx];
        memset(scores_local, 0, sizeof(size_t)*100);
        nfileitems = nclean = ndirty = 0;
        docs_local = bnodes_local = 0;

        size_t i = 0;
        for (; i < fname->num_shards; ++i) {
            spin_lock(&fname->shards[i].lock);
            ee = list_begin(&fname->shards[i].cleanlist);
            a = avl_first(&fname->shards[i].tree);

            while(ee){
                item = _get_entry(ee, struct bcache_item, list_elem);
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                nclean++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                ee = list_next(ee);
            }
            while(a){
                dirty = _get_entry(a, struct dirty_item, avl);
                item = dirty->item;
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                ndirty++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                a = avl_next(a);
            }
            spin_unlock(&fname->shards[i].lock);
        }

        ADD2BUF("%3d %20s (%6d)(%6d)(c%6d d%6d)",
               (int)nfiles+1, fname->filename,
               (int)atomic_get_uint64_t(&fname->nitems),
               (int)atomic_get_uint64_t(&fname->nvictim),
               (int)nclean, (int)ndirty);
        ADD2BUF("%6d%6d", (int)docs_local, (int)bnodes_local);
        for (i=0;i<=n;++i){
            ADD2BUF("%6d ", (int)scores_local[i]);
        }
        ADD2BUF("\n");

        docs += docs_local;
        bnodes += bnodes_local;

        nfiles++;

        if (ss.size() + ss_local.size() > 4000) {
            BCACHE_LOG("%s", ss.c_str());
            ss.clear();
        }
        ss += ss_local;
        ss_local.clear();
    }
    reader_unlock(&filelist_lock);
    ADD2BUF(" ===\n");

    ADD2BUF("%d files %d items\n", (int)nfiles, (int)nitems);
    for (i=0;i<=n;++i){
        ADD2BUF("[%d]: %d\n", (int)i, (int)scores[i]);
    }
    ADD2BUF("Documents: %d blocks\n", (int)docs);
    ADD2BUF("Index nodes: %d blocks\n", (int)bnodes);

    if (ss.size() + ss_local.size() > 4000) {
        BCACHE_LOG("%s", ss.c_str());
        ss.clear();
    }
    ss += ss_local;
    ss_local.clear();
    BCACHE_LOG("%s", ss.c_str());
}